

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O0

void flavor_assign_random(uint8_t tval)

{
  flavor *local_20;
  flavor *f;
  wchar_t choice;
  wchar_t flavor_count;
  wchar_t i;
  uint8_t tval_local;
  
  f._4_4_ = 0;
  for (local_20 = flavors; local_20 != (flavor *)0x0; local_20 = local_20->next) {
    if ((local_20->tval == tval) && (local_20->sval == '\0')) {
      f._4_4_ = f._4_4_ + 1;
    }
  }
  choice = L'\0';
  do {
    if ((int)(uint)z_info->k_max <= choice) {
      return;
    }
    if ((k_info[choice].tval == (uint)tval) && (k_info[choice].flavor == (flavor *)0x0)) {
      if (f._4_4_ == 0) {
        quit_fmt("Not enough flavors for tval %d.",(ulong)tval);
      }
      f._0_4_ = Rand_div(f._4_4_);
      for (local_20 = flavors; local_20 != (flavor *)0x0; local_20 = local_20->next) {
        if ((local_20->tval == tval) && (local_20->sval == '\0')) {
          if ((uint32_t)f == 0) {
            k_info[choice].flavor = local_20;
            local_20->sval = (uint8_t)k_info[choice].sval;
            if (tval == '\x19') {
              local_20->text = scroll_adj[k_info[choice].sval];
            }
            f._4_4_ = f._4_4_ - 1;
            break;
          }
          f._0_4_ = (uint32_t)f - 1;
        }
      }
    }
    choice = choice + L'\x01';
  } while( true );
}

Assistant:

static void flavor_assign_random(uint8_t tval)
{
	int i;
	int flavor_count = 0;
	int choice;
	struct flavor *f;

	/* Count the random flavors for the given tval */
	for (f = flavors; f; f = f->next)
		if (f->tval == tval && f->sval == SV_UNKNOWN)
			flavor_count++;

	for (i = 0; i < z_info->k_max; i++) {
		if (k_info[i].tval != tval || k_info[i].flavor)
			continue;

		if (!flavor_count)
			quit_fmt("Not enough flavors for tval %d.", tval);

		choice = randint0(flavor_count);
	
		for (f = flavors; f; f = f->next) {
			if (f->tval != tval || f->sval != SV_UNKNOWN)
				continue;

			if (choice == 0) {
				k_info[i].flavor = f;
				f->sval = k_info[i].sval;
				if (tval == TV_SCROLL)
					f->text = scroll_adj[k_info[i].sval];
				flavor_count--;
				break;
			}

			choice--;
		}
	}
}